

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<const_kj::StringPtr> * __thiscall
kj::heapArray<kj::StringPtr_const,kj::StringPtr_const*>
          (Array<const_kj::StringPtr> *__return_storage_ptr__,kj *this,StringPtr *begin,
          StringPtr *end)

{
  undefined1 local_40 [8];
  ArrayBuilder<const_kj::StringPtr> builder;
  StringPtr *end_local;
  StringPtr *begin_local;
  
  builder.disposer = (ArrayDisposer *)begin;
  heapArrayBuilder<kj::StringPtr_const>
            ((ArrayBuilder<const_kj::StringPtr> *)local_40,(kj *)((long)begin - (long)this >> 4),
             (size_t)begin);
  ArrayBuilder<kj::StringPtr_const>::addAll<kj::StringPtr_const*,false>
            ((ArrayBuilder<kj::StringPtr_const> *)local_40,(StringPtr *)this,
             (StringPtr *)builder.disposer);
  ArrayBuilder<const_kj::StringPtr>::finish
            (__return_storage_ptr__,(ArrayBuilder<const_kj::StringPtr> *)local_40);
  ArrayBuilder<const_kj::StringPtr>::~ArrayBuilder((ArrayBuilder<const_kj::StringPtr> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}